

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

ExpressionSpec *
rsg::anon_unknown_0::chooseExpression
          (GeneratorState *state,ExpressionSpec *specs,int numSpecs,ConstValueRangeAccess valueRange
          )

{
  int iVar1;
  ExpressionSpec *pEVar2;
  long lVar3;
  ExpressionSpec *pEVar4;
  ulong uVar5;
  bool bVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float weights [30];
  float afStack_a8 [30];
  
  uVar5 = (ulong)(uint)numSpecs;
  if (0 < numSpecs) {
    lVar3 = 0;
    do {
      uVar7 = (**(code **)((long)&specs->getWeight + lVar3 * 4))(state);
      *(undefined4 *)((long)afStack_a8 + lVar3) = uVar7;
      lVar3 = lVar3 + 4;
    } while (uVar5 * 4 - lVar3 != 0);
  }
  fVar8 = 0.0;
  if (numSpecs != 0) {
    lVar3 = 0;
    iVar1 = 1;
    do {
      fVar8 = fVar8 + afStack_a8[lVar3];
      lVar3 = (long)iVar1;
      bVar6 = iVar1 != numSpecs;
      iVar1 = iVar1 + 1;
    } while (bVar6);
  }
  pEVar4 = specs + uVar5;
  fVar9 = deRandom_getFloat(&state->m_random->m_rnd);
  if (numSpecs != 0) {
    iVar1 = 1;
    lVar3 = 0;
    fVar10 = 0.0;
    pEVar2 = specs;
    do {
      fVar10 = fVar10 + afStack_a8[lVar3];
      if (fVar8 * fVar9 + 0.0 < fVar10) {
        return pEVar2;
      }
      if (0.0 < afStack_a8[lVar3]) {
        pEVar4 = pEVar2;
      }
      lVar3 = (long)iVar1;
      pEVar2 = specs + lVar3;
      iVar1 = iVar1 + 1;
    } while (lVar3 * 0x10 != uVar5 * 0x10);
  }
  return pEVar4;
}

Assistant:

const ExpressionSpec* chooseExpression (GeneratorState& state, const ExpressionSpec* specs, int numSpecs, ConstValueRangeAccess valueRange)
{
	float weights[MAX_EXPRESSION_SPECS];

	DE_ASSERT(numSpecs <= (int)DE_LENGTH_OF_ARRAY(weights));

	// Compute weights
	for (int ndx = 0; ndx < numSpecs; ndx++)
		weights[ndx] = specs[ndx].getWeight(state, valueRange);

	// Choose
	return &state.getRandom().chooseWeighted<const ExpressionSpec&>(specs, specs+numSpecs, weights);
}